

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::Swap(Reflection *this,Message *message1,Message *message2)

{
  bool bVar1;
  int iVar2;
  Reflection *pRVar3;
  Descriptor *this_00;
  Arena *pAVar4;
  Arena *pAVar5;
  undefined4 extraout_var;
  uint32 *puVar7;
  uint32 *puVar8;
  FieldDescriptor *pFVar9;
  OneofDescriptor *pOVar10;
  UnknownFieldSet *x;
  Reflection *in_RDX;
  Reflection *in_RSI;
  Reflection *in_RDI;
  FieldDescriptor *in_stack_00000058;
  Message *in_stack_00000060;
  Message *in_stack_00000068;
  Reflection *in_stack_00000070;
  int i_3;
  int oneof_decl_count;
  FieldDescriptor *field_1;
  int i_2;
  int i_1;
  int has_bits_size;
  FieldDescriptor *field;
  int i;
  int fields_with_has_bits;
  uint32 *has_bits2;
  uint32 *has_bits1;
  Message *temp;
  OneofDescriptor *in_stack_00000198;
  Message *in_stack_000001a0;
  Message *in_stack_000001a8;
  Reflection *in_stack_000001b0;
  LogMessage *in_stack_fffffffffffffe28;
  Reflection *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffe40;
  LogMessage *in_stack_fffffffffffffe68;
  LogMessage *in_stack_fffffffffffffe70;
  Descriptor *in_stack_fffffffffffffe98;
  Reflection *in_stack_fffffffffffffea0;
  int local_f0;
  int local_dc;
  int local_d8;
  int local_c8;
  int local_c4;
  Message *in_stack_ffffffffffffffe0;
  long *plVar6;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  if (in_RSI != in_RDX) {
    pRVar3 = Message::GetReflection((Message *)in_stack_fffffffffffffe30);
    if (pRVar3 != in_RDI) {
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffe40,level,(char *)in_stack_fffffffffffffe30,
                 (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      this_00 = Message::GetDescriptor((Message *)in_stack_fffffffffffffe30);
      Descriptor::full_name_abi_cxx11_(this_00);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffe30,(string *)in_stack_fffffffffffffe28);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      Descriptor::full_name_abi_cxx11_(in_RDI->descriptor_);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffe30,(string *)in_stack_fffffffffffffe28);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      internal::LogMessage::~LogMessage((LogMessage *)0x4236bb);
    }
    pRVar3 = Message::GetReflection((Message *)in_stack_fffffffffffffe30);
    if (pRVar3 != in_RDI) {
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffe40,level,(char *)in_stack_fffffffffffffe30,
                 (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffea0 =
           (Reflection *)
           internal::LogMessage::operator<<
                     ((LogMessage *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe98 = Message::GetDescriptor((Message *)in_stack_fffffffffffffe30);
      Descriptor::full_name_abi_cxx11_(in_stack_fffffffffffffe98);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffe30,(string *)in_stack_fffffffffffffe28);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      Descriptor::full_name_abi_cxx11_(in_RDI->descriptor_);
      in_stack_fffffffffffffe70 =
           internal::LogMessage::operator<<
                     ((LogMessage *)in_stack_fffffffffffffe30,(string *)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe68 =
           internal::LogMessage::operator<<
                     ((LogMessage *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      internal::LogMessage::~LogMessage((LogMessage *)0x423810);
    }
    pAVar4 = GetArena(in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
    pAVar5 = GetArena(in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
    if (pAVar4 == pAVar5) {
      bVar1 = internal::ReflectionSchema::HasHasbits(&in_RDI->schema_);
      if (bVar1) {
        puVar7 = MutableHasBits(in_stack_fffffffffffffea0,(Message *)in_stack_fffffffffffffe98);
        puVar8 = MutableHasBits(in_stack_fffffffffffffea0,(Message *)in_stack_fffffffffffffe98);
        local_c4 = 0;
        for (local_c8 = 0; iVar2 = Descriptor::field_count(in_RDI->descriptor_), local_c8 < iVar2;
            local_c8 = local_c8 + 1) {
          pFVar9 = Descriptor::field(in_RDI->descriptor_,local_c8);
          bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x423a3a);
          if ((!bVar1) &&
             (pOVar10 = FieldDescriptor::containing_oneof(pFVar9), pOVar10 == (OneofDescriptor *)0x0
             )) {
            local_c4 = local_c4 + 1;
          }
        }
        for (local_d8 = 0; local_d8 < (local_c4 + 0x1f) / 0x20; local_d8 = local_d8 + 1) {
          std::swap<unsigned_int>(puVar7 + local_d8,puVar8 + local_d8);
        }
      }
      for (local_dc = 0; local_dc <= in_RDI->last_non_weak_field_index_; local_dc = local_dc + 1) {
        pFVar9 = Descriptor::field(in_RDI->descriptor_,local_dc);
        pOVar10 = FieldDescriptor::containing_oneof(pFVar9);
        if (pOVar10 == (OneofDescriptor *)0x0) {
          SwapField(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
        }
      }
      iVar2 = Descriptor::oneof_decl_count(in_RDI->descriptor_);
      for (local_f0 = 0; local_f0 < iVar2; local_f0 = local_f0 + 1) {
        Descriptor::oneof_decl(in_RDI->descriptor_,local_f0);
        SwapOneofField(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
      }
      bVar1 = internal::ReflectionSchema::HasExtensionSet(&in_RDI->schema_);
      if (bVar1) {
        in_stack_fffffffffffffe30 =
             (Reflection *)
             MutableExtensionSet(in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
        MutableExtensionSet(in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
        internal::ExtensionSet::Swap
                  ((ExtensionSet *)in_stack_fffffffffffffe70,
                   (ExtensionSet *)in_stack_fffffffffffffe68);
      }
      x = MutableUnknownFields(in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
      MutableUnknownFields(in_stack_fffffffffffffe30,(Message *)x);
      UnknownFieldSet::Swap((UnknownFieldSet *)in_stack_fffffffffffffe30,x);
    }
    else {
      pRVar3 = in_RSI;
      pAVar4 = GetArena(in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
      iVar2 = (*((MessageLite *)&in_RSI->descriptor_)->_vptr_MessageLite[4])(in_RSI,pAVar4);
      plVar6 = (long *)CONCAT44(extraout_var,iVar2);
      (**(code **)(*plVar6 + 0x88))(plVar6,in_RDX);
      (*((MessageLite *)&in_RDX->descriptor_)->_vptr_MessageLite[0x10])(in_RDX,pRVar3);
      Swap(pRVar3,(Message *)in_RDX,in_stack_ffffffffffffffe0);
      pAVar4 = GetArena(in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
      if ((pAVar4 == (Arena *)0x0) && (plVar6 != (long *)0x0)) {
        (**(code **)(*plVar6 + 8))();
      }
    }
  }
  return;
}

Assistant:

void Reflection::Swap(Message* message1, Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (GetArena(message1) != GetArena(message2)) {
    // Slow copy path.
    // Use our arena as temp space, if available.
    Message* temp = message1->New(GetArena(message1));
    temp->MergeFrom(*message2);
    message2->CopyFrom(*message1);
    Swap(message1, temp);
    if (GetArena(message1) == nullptr) {
      delete temp;
    }
    return;
  }

  if (schema_.HasHasbits()) {
    uint32* has_bits1 = MutableHasBits(message1);
    uint32* has_bits2 = MutableHasBits(message2);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || field->containing_oneof()) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(has_bits1[i], has_bits2[i]);
    }
  }

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof()) continue;
    SwapField(message1, message2, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    SwapOneofField(message1, message2, descriptor_->oneof_decl(i));
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}